

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

ON_DimStyle * __thiscall ON_BinaryArchive::Internal_ArchiveCurrentDimStyle(ON_BinaryArchive *this)

{
  ON_DimStyle *this_00;
  LengthUnitSystem length_unit_system;
  bool bVar1;
  LengthUnitSystem u1;
  uint uVar2;
  ON_UUID *b;
  ON_DimStyle *pOVar3;
  ON_DimStyle *pOVar4;
  ulong uVar5;
  ON_DimStyle *pOVar6;
  ON_DimStyle *pOVar7;
  double dVar8;
  double dVar9;
  ON_DimStyle *current_ds;
  ON_UUID local_40;
  
  if (this->m_archive_3dm_settings == (ON_3dmSettings *)0x0) {
    length_unit_system = Unset;
  }
  else {
    length_unit_system =
         ON_UnitSystem::UnitSystem
                   (&(this->m_archive_3dm_settings->m_ModelUnitsAndTolerances).m_unit_system);
    local_40 = ON_3dmSettings::CurrentDimensionStyleId(this->m_archive_3dm_settings);
    bVar1 = ::operator!=(&ON_nil_uuid,&local_40);
    if ((bVar1) && ((this->m_archive_dim_style_table).m_count != 0)) {
      uVar5 = 0;
      do {
        pOVar7 = (this->m_archive_dim_style_table).m_a[uVar5];
        bVar1 = ON_ModelComponent::ParentIdIsNotNil(&pOVar7->super_ON_ModelComponent);
        if (!bVar1) {
          b = ON_ModelComponent::Id(&pOVar7->super_ON_ModelComponent);
          bVar1 = ::operator==(&local_40,b);
          if (bVar1) {
            return pOVar7;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (uint)(this->m_archive_dim_style_table).m_count);
    }
    uVar2 = ON_3dmSettings::CurrentDimensionStyleIndex(this->m_archive_3dm_settings);
    if ((-1 < (int)uVar2) && ((int)uVar2 < (this->m_archive_dim_style_table).m_count)) {
      pOVar7 = (this->m_archive_dim_style_table).m_a[uVar2];
      if ((pOVar7 != (ON_DimStyle *)0x0) &&
         (bVar1 = ON_ModelComponent::ParentIdIsNotNil(&pOVar7->super_ON_ModelComponent), bVar1)) {
        return (this->m_archive_dim_style_table).m_a[uVar2];
      }
    }
    bVar1 = ON::IsTerrestrialLengthUnit(length_unit_system);
    if ((bVar1) && ((this->m_archive_dim_style_table).m_count != 0)) {
      uVar5 = 0;
      pOVar7 = (ON_DimStyle *)0x0;
      pOVar3 = (ON_DimStyle *)0x0;
      dVar8 = 1e+300;
      do {
        this_00 = (this->m_archive_dim_style_table).m_a[uVar5];
        bVar1 = ON_ModelComponent::ParentIdIsNotNil(&this_00->super_ON_ModelComponent);
        pOVar4 = pOVar7;
        pOVar6 = pOVar3;
        dVar9 = dVar8;
        if ((!bVar1) && (bVar1 = ON_DimStyle::UnitSystemIsSet(this_00), bVar1)) {
          u1 = ON_DimStyle::UnitSystem(this_00);
          if (u1 == length_unit_system) {
            return this_00;
          }
          if ((this->m_archive_current_dim_style == (ON_DimStyle *)0x0) &&
             (bVar1 = ON::IsUnitedStatesCustomaryLengthUnit(length_unit_system), pOVar4 = this_00,
             u1 != Inches || !bVar1)) {
            bVar1 = ON::IsMetricLengthUnit(length_unit_system);
            pOVar4 = pOVar7;
            if (bVar1) {
              pOVar4 = this_00;
            }
            if (u1 != Millimeters) {
              pOVar4 = pOVar7;
            }
          }
          dVar9 = ON::UnitScale(length_unit_system,u1);
          if (dVar9 < 1.0) {
            dVar9 = ON::UnitScale(u1,length_unit_system);
          }
          pOVar6 = this_00;
          if (dVar9 <= 1.0 || dVar8 <= dVar9) {
            pOVar6 = pOVar3;
            dVar9 = dVar8;
          }
        }
        uVar5 = uVar5 + 1;
        pOVar7 = pOVar4;
        pOVar3 = pOVar6;
        dVar8 = dVar9;
      } while (uVar5 < (uint)(this->m_archive_dim_style_table).m_count);
      if (pOVar4 != (ON_DimStyle *)0x0) {
        return pOVar4;
      }
      if (pOVar6 != (ON_DimStyle *)0x0) {
        return pOVar6;
      }
    }
  }
  if ((this->m_archive_dim_style_table).m_count != 0) {
    uVar5 = 0;
    do {
      pOVar7 = (this->m_archive_dim_style_table).m_a[uVar5];
      bVar1 = ON_ModelComponent::ParentIdIsNotNil(&pOVar7->super_ON_ModelComponent);
      if ((!bVar1) && (bVar1 = ON_DimStyle::UnitSystemIsSet(pOVar7), bVar1)) {
        return pOVar7;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (uint)(this->m_archive_dim_style_table).m_count);
  }
  bVar1 = ON::IsUnitedStatesCustomaryLengthUnit(length_unit_system);
  if (bVar1) {
    pOVar7 = &ON_DimStyle::DefaultInchDecimal;
  }
  else {
    bVar1 = ON::IsMetricLengthUnit(length_unit_system);
    if (bVar1) {
      pOVar7 = &ON_DimStyle::DefaultMillimeterSmall;
    }
    else {
      pOVar7 = &ON_DimStyle::Default;
    }
  }
  pOVar3 = (ON_DimStyle *)operator_new(0x450);
  ON_DimStyle::ON_DimStyle(pOVar3,pOVar7);
  local_40._0_8_ = pOVar3;
  ON_ModelComponent::SetId((ON_ModelComponent *)pOVar3);
  ON_ModelComponent::SetIndex((ON_ModelComponent *)pOVar3,(this->m_archive_dim_style_table).m_count)
  ;
  if (this->m_mode == read3dm) {
    Internal_Read3dmUpdateManifest(this,(ON_ModelComponent *)pOVar3);
  }
  else {
    ON_ComponentManifest::AddComponentToManifest
              (&this->m_manifest,(ON_ModelComponent *)pOVar3,true,(ON_wString *)0x0);
  }
  ON_SimpleArray<ON_DimStyle_*>::Append(&this->m_archive_dim_style_table,(ON_DimStyle **)&local_40);
  return (ON_DimStyle *)local_40._0_8_;
}

Assistant:

const ON_DimStyle* ON_BinaryArchive::Internal_ArchiveCurrentDimStyle()
{
  ON::LengthUnitSystem model_unit_system = ON::LengthUnitSystem::Unset;
  if (nullptr != m_archive_3dm_settings)
  {
    model_unit_system = m_archive_3dm_settings->m_ModelUnitsAndTolerances.m_unit_system.UnitSystem();
    const ON_UUID id = m_archive_3dm_settings->CurrentDimensionStyleId();
    if (ON_nil_uuid != id)
    {
      for (unsigned int i = 0; i < m_archive_dim_style_table.UnsignedCount(); i++)
      {
        const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
        if (archive_dim_style->ParentIdIsNotNil())
          continue;
        if ( id == archive_dim_style->Id())
        {
          return archive_dim_style;
          break;
        }
      }
    }

    const int index = m_archive_3dm_settings->CurrentDimensionStyleIndex();
    if (index >= 0 && index < m_archive_dim_style_table.Count() && nullptr != m_archive_dim_style_table[index] && m_archive_dim_style_table[index]->ParentIdIsNotNil() )
      return m_archive_dim_style_table[index];

    if (ON::IsTerrestrialLengthUnit(model_unit_system))
    {
      double unit_scale = 1e300;
      const ON_DimStyle* inch_mm_ds = nullptr;
      const ON_DimStyle* unit_scale_ds = nullptr;
      for (unsigned int i = 0; i < m_archive_dim_style_table.UnsignedCount(); i++)
      {
        const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
        if (archive_dim_style->ParentIdIsNotNil())
          continue;
        if (false == archive_dim_style->UnitSystemIsSet())
          continue;

        const ON::LengthUnitSystem ds_unit_system = archive_dim_style->UnitSystem();
        if (ds_unit_system == model_unit_system)
          return archive_dim_style;

        if (nullptr == m_archive_current_dim_style)
        {
          if (ON::IsUnitedStatesCustomaryLengthUnit(model_unit_system) && ON::LengthUnitSystem::Inches == ds_unit_system)
          {
            inch_mm_ds = archive_dim_style;
          }
          else if (ON::IsMetricLengthUnit(model_unit_system) && ON::LengthUnitSystem::Millimeters == ds_unit_system)
          {
            inch_mm_ds = archive_dim_style;
          }
        }

        double s = ON::UnitScale(model_unit_system, ds_unit_system);
        if (s < 1.0)
          s = ON::UnitScale(ds_unit_system, model_unit_system);
        if (s > 1.0 && s < unit_scale)
        {
          unit_scale_ds = archive_dim_style;
          unit_scale = s;
        }
      }
      if (nullptr != inch_mm_ds)
        return inch_mm_ds;
      if (nullptr != unit_scale_ds)
        return unit_scale_ds;
    }
  }

  for (unsigned int i = 0; i < m_archive_dim_style_table.UnsignedCount(); i++)
  {
    const ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
    if (archive_dim_style->ParentIdIsNotNil())
      continue;
    if (false == archive_dim_style->UnitSystemIsSet())
      continue;
    return archive_dim_style;
  }
  
  const ON_DimStyle* system_ds;
  if (ON::IsUnitedStatesCustomaryLengthUnit(model_unit_system))
    system_ds = &ON_DimStyle::DefaultInchDecimal;  
  else if (ON::IsMetricLengthUnit(model_unit_system))
    system_ds = &ON_DimStyle::DefaultMillimeterSmall;
  else
    system_ds = &ON_DimStyle::Default;

  // invent a current dimstyle. Happens when reading files written by Rhino 1.1.
  ON_DimStyle* current_ds = new ON_DimStyle(*system_ds);
  current_ds->SetId();
  current_ds->SetIndex(m_archive_dim_style_table.Count());
  if ( ON::archive_mode::read3dm == Mode())
    Internal_Read3dmUpdateManifest(*current_ds);
  else
    m_manifest.AddComponentToManifest(*current_ds, true, nullptr);

  m_archive_dim_style_table.Append(current_ds);

  return current_ds;
}